

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genData.hpp
# Opt level: O0

pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *
genPointPair<double>
          (pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
           *__return_storage_ptr__,Matrix<double,_4,_4,_0,_4,_4> *T)

{
  Homogeneous<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_d0;
  pair<Eigen::Homogeneous<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
  local_c8;
  Homogeneous<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_90;
  Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Homogeneous<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_0>
  local_88;
  undefined1 local_78 [8];
  Matrix<double,_4,_1,_0,_4,_1> Q;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_50;
  Matrix<double,3,1,0,3,1> local_30 [8];
  Matrix<double,_3,_1,_0,_3,_1> P;
  Matrix<double,_4,_4,_0,_4,_4> *T_local;
  
  P.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)T;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Random
            ((RandomReturnType *)
             ((long)Q.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array + 0x1d),3);
  Q.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]._0_4_ =
       0x28;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
  ::operator*(&local_50,
              (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
               *)((long)Q.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array + 0x1d),
              (int *)(Q.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                      m_data.array + 3));
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,1,0,3,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_30,(EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                       *)&local_50);
  local_90.m_matrix =
       (Nested)Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::homogeneous
                         ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_30);
  local_88 = Eigen::operator*((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)T,&local_90);
  Eigen::Matrix<double,4,1,0,4,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Homogeneous<Eigen::Matrix<double,3,1,0,3,1>,0>,0>>
            ((Matrix<double,4,1,0,4,1> *)local_78,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Homogeneous<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_0>_>
              *)&local_88);
  local_d0.m_matrix =
       (Nested)Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::homogeneous
                         ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_30);
  std::
  make_pair<Eigen::Homogeneous<Eigen::Matrix<double,3,1,0,3,1>,0>,Eigen::Matrix<double,4,1,0,4,1>&>
            (&local_c8,&local_d0,(Matrix<double,_4,_1,_0,_4,_1> *)local_78);
  std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::
  pair<Eigen::Homogeneous<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_true>
            (__return_storage_ptr__,&local_c8);
  return __return_storage_ptr__;
}

Assistant:

std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>> genPointPair(Eigen::Matrix<floatPrec,4,4> T){
    
    // get a random 3D point (in homogenous coordinates)
    Eigen::Matrix<floatPrec,3,1> P = Eigen::Matrix<floatPrec, 3, 1>::Random(3) * int(POINTSWITHINCUBE);
    // requires as input the pose between the two 3D scans,
    // to apply the respective transformation to the
    // point in RefB
    
    Eigen::Matrix<floatPrec,4,1> Q = T * P.homogeneous();

    return std::make_pair(P.homogeneous(),Q);
}